

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSwapchainTests.cpp
# Opt level: O0

void __thiscall
vkt::wsi::anon_unknown_0::populateSwapchainGroup
          (anon_unknown_0 *this,TestCaseGroup *testGroup,GroupParameters params)

{
  anon_unknown_0 *group;
  undefined8 testFunc;
  char *__s;
  TestParameters local_8c;
  allocator<char> local_81;
  string local_80;
  allocator<char> local_49;
  string local_48;
  TestDimension local_28;
  TestDimension local_24;
  TestDimension testDimension;
  int dimensionNdx;
  TestCaseGroup *testGroup_local;
  GroupParameters params_local;
  
  params_local._0_8_ = params._0_8_;
  testGroup_local._0_4_ = (Type)testGroup;
  _testDimension = this;
  for (local_24 = TEST_DIMENSION_MIN_IMAGE_COUNT; group = _testDimension, (int)local_24 < 10;
      local_24 = local_24 + TEST_DIMENSION_IMAGE_FORMAT) {
    local_28 = local_24;
    __s = getTestDimensionName(local_24);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,__s,&local_49);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"",&local_81);
    testFunc = params_local._0_8_;
    TestParameters::TestParameters(&local_8c,(Type)testGroup_local,local_28);
    addFunctionCase<vkt::wsi::(anonymous_namespace)::TestParameters>
              ((TestCaseGroup *)group,&local_48,&local_80,(Function)testFunc,local_8c);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator(&local_81);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
  }
  return;
}

Assistant:

void populateSwapchainGroup (tcu::TestCaseGroup* testGroup, GroupParameters params)
{
	for (int dimensionNdx = 0; dimensionNdx < TEST_DIMENSION_LAST; ++dimensionNdx)
	{
		const TestDimension		testDimension	= (TestDimension)dimensionNdx;

		addFunctionCase(testGroup, getTestDimensionName(testDimension), "", params.function, TestParameters(params.wsiType, testDimension));
	}
}